

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O1

void __thiscall bandit::reporter::spec::it_failed(spec *this,string *desc,assertion_exception *ex)

{
  ostream *poVar1;
  char cVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  progress_base::it_failed((progress_base *)this,desc,ex);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((this->super_colored_base).stm_,"FAILED",6);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  poVar1 = (this->super_colored_base).stm_;
  cVar2 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        progress_base::it_failed(desc, ex);
        stm_ << colorizer_.bad();
        stm_ << "FAILED";
        stm_ << colorizer_.reset();
        stm_ << std::endl;
        stm_.flush();
      }